

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenmesh::tetalldihedral
          (tetgenmesh *this,point pa,point pb,point pc,point pd,double *cosdd,double *cosmaxd,
          double *cosmind)

{
  point pb_00;
  long lVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  double (*N_00) [3];
  double *pdVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double vol;
  double N [4] [3];
  double local_a8;
  point local_a0;
  double local_98 [13];
  
  local_a8 = 0.0;
  N_00 = (double (*) [3])local_98;
  local_a0 = pa;
  tetallnormal(this,pa,pb,pc,pd,N_00,&local_a8);
  if (0.0 < local_a8) {
    pdVar9 = local_98;
    lVar8 = 0;
    do {
      dVar11 = local_98[lVar8 * 3 + 2] * local_98[lVar8 * 3 + 2] +
               local_98[lVar8 * 3] * local_98[lVar8 * 3] +
               local_98[lVar8 * 3 + 1] * local_98[lVar8 * 3 + 1];
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        lVar1 = 0;
        do {
          pdVar9[lVar1] = pdVar9[lVar1] / dVar11;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
      }
      else {
        local_a8 = 0.0;
      }
      lVar8 = lVar8 + 1;
      pdVar9 = pdVar9 + 3;
    } while (lVar8 != 4);
  }
  if (local_a8 <= 0.0) {
    lVar8 = 0;
    facenormal(this,pc,pb,pd,(double *)N_00,1,(double *)0x0);
    pb_00 = local_a0;
    facenormal(this,local_a0,pc,pd,local_98 + 3,1,(double *)0x0);
    facenormal(this,pb,pb_00,pd,local_98 + 6,1,(double *)0x0);
    facenormal(this,pb_00,pb,pc,local_98 + 9,1,(double *)0x0);
    do {
      dVar11 = local_98[lVar8 * 3 + 2] * local_98[lVar8 * 3 + 2] +
               local_98[lVar8 * 3] * local_98[lVar8 * 3] +
               local_98[lVar8 * 3 + 1] * local_98[lVar8 * 3 + 1];
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      if ((dVar11 == 0.0) && (!NAN(dVar11))) {
        if (cosdd != (double *)0x0) {
          lVar8 = 0;
          do {
            cosdd[lVar8] = -1.0;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 6);
        }
        if (cosmaxd != (double *)0x0) {
          *cosmaxd = -1.0;
        }
        if (cosmind != (double *)0x0) {
          *cosmind = -1.0;
        }
        return false;
      }
      lVar1 = 0;
      do {
        (*N_00)[lVar1] = (*N_00)[lVar1] / dVar11;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      lVar8 = lVar8 + 1;
      N_00 = N_00 + 1;
    } while (lVar8 != 4);
  }
  uVar2 = 0;
  puVar3 = &DAT_00177700;
  puVar4 = &DAT_001776e8;
  uVar5 = 0;
  uVar6 = 0;
  do {
    if (uVar2 < 6) {
      uVar6 = *puVar4;
      uVar5 = *puVar3;
    }
    uVar10 = (ulong)uVar6;
    uVar7 = (ulong)uVar5;
    dVar11 = local_98[uVar10 * 3 + 2] * local_98[uVar7 * 3 + 2] +
             local_98[uVar10 * 3] * local_98[uVar7 * 3] +
             local_98[uVar10 * 3 + 1] * local_98[uVar7 * 3 + 1];
    uVar10 = -(ulong)(1.0 < dVar11);
    dVar12 = (double)(uVar10 & 0xbff0000000000000 | ~uVar10 & (ulong)-dVar11);
    dVar11 = 1.0;
    if (dVar12 <= 1.0) {
      dVar11 = dVar12;
    }
    if (cosdd != (double *)0x0) {
      cosdd[uVar2] = dVar11;
    }
    if (cosmaxd != (double *)0x0 || cosmind != (double *)0x0) {
      if (uVar2 == 0) {
        if (cosmaxd != (double *)0x0) {
          *cosmaxd = dVar11;
        }
        if (cosmind != (double *)0x0) goto LAB_0011a0f0;
      }
      else {
        if (cosmaxd != (double *)0x0) {
          dVar12 = dVar11;
          if (*cosmaxd <= dVar11) {
            dVar12 = *cosmaxd;
          }
          *cosmaxd = dVar12;
        }
        if (cosmind != (double *)0x0) {
          if (dVar11 <= *cosmind) {
            dVar11 = *cosmind;
          }
LAB_0011a0f0:
          *cosmind = dVar11;
        }
      }
    }
    uVar2 = uVar2 + 1;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
    if (uVar2 == 6) {
      return true;
    }
  } while( true );
}

Assistant:

bool tetgenmesh::tetalldihedral(point pa, point pb, point pc, point pd,
                                REAL* cosdd, REAL* cosmaxd, REAL* cosmind)
{
  REAL N[4][3], vol, cosd, len;
  int f1 = 0, f2 = 0, i, j;

  vol = 0; // Check if the tet is valid or not.

  // Get four normals of faces of the tet.
  tetallnormal(pa, pb, pc, pd, N, &vol);

  if (vol > 0) {
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        vol = 0; //assert(0);
      }
    }
  }

  if (vol <= 0) { // if (vol == 0.0) {
    // A degenerated tet or an inverted tet.
    facenormal(pc, pb, pd, N[0], 1, NULL);
    facenormal(pa, pc, pd, N[1], 1, NULL);
    facenormal(pb, pa, pd, N[2], 1, NULL);
    facenormal(pa, pb, pc, N[3], 1, NULL);
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        break; // Not a valid normal.
      }
    }
    if (i < 4) {
      // Do not calculate dihedral angles.
      // Set all angles be 0 degree. There will be no quality optimization for
      //   this tet! Use volume optimization to correct it.
      if (cosdd != NULL) {
        for (i = 0; i < 6; i++) {
          cosdd[i] = -1.0; // 180 degree.
        }
      }
      // This tet has zero volume.
      if (cosmaxd != NULL) {
        *cosmaxd = -1.0; // 180 degree.
      }
      if (cosmind != NULL) {
        *cosmind = -1.0; // 180 degree.
      }
      return false;
    }
  }

  // Calculate the cosine of the dihedral angles of the edges.
  for (i = 0; i < 6; i++) {
    switch (i) {
    case 0: f1 = 0; f2 = 1; break; // [c,d].
    case 1: f1 = 1; f2 = 2; break; // [a,d].
    case 2: f1 = 2; f2 = 3; break; // [a,b].
    case 3: f1 = 0; f2 = 3; break; // [b,c].
    case 4: f1 = 2; f2 = 0; break; // [b,d].
    case 5: f1 = 1; f2 = 3; break; // [a,c].
    }
    cosd = -dot(N[f1], N[f2]);
    if (cosd < -1.0) cosd = -1.0; // Rounding.
    if (cosd >  1.0) cosd =  1.0; // Rounding.
    if (cosdd) cosdd[i] = cosd;
    if (cosmaxd || cosmind) {
      if (i == 0) {
        if (cosmaxd) *cosmaxd = cosd;
        if (cosmind) *cosmind = cosd;
      } else {
        if (cosmaxd) *cosmaxd = cosd < *cosmaxd ? cosd : *cosmaxd;
        if (cosmind) *cosmind = cosd > *cosmind ? cosd : *cosmind;
      }
    }
  }

  return true;
}